

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_1_autoincrement_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_PREINC,G->val[-2]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_autoincrement_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define n G->val[-1]
#define v G->val[-2]
  yyprintf((stderr, "do yy_1_autoincrement_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_PREINC, v); }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_PREINC, v); ;
#undef n
#undef v
}